

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int ghc::filesystem::rename(char *__old,char *__new)

{
  bool bVar1;
  int code;
  undefined7 extraout_var;
  filesystem_error *this;
  error_code ec_00;
  string local_48;
  undefined1 auStack_28 [8];
  error_code ec;
  path *to_local;
  path *from_local;
  
  ec._M_cat = (error_category *)__new;
  std::error_code::error_code((error_code *)auStack_28);
  rename((filesystem *)__old,(char *)ec._M_cat,auStack_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_28);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._0_8_ = (ulong)auStack_28 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_48,(path *)__old,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void rename(const path& from, const path& to)
{
    std::error_code ec;
    rename(from, to, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), from, to, ec);
    }
}